

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosString.cpp
# Opt level: O2

string * adios2::helper::AddExtension(string *__return_storage_ptr__,string *name,string *extension)

{
  long lVar1;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  lVar1 = std::__cxx11::string::find((string *)name,(ulong)extension);
  if (lVar1 != name->_M_string_length - 3) {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AddExtension(const std::string &name, const std::string extension) noexcept
{
    std::string result(name);
    if (name.find(extension) != name.size() - 3)
    {
        result += extension;
    }
    return result;
}